

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEditPrivate::interpret(QDateTimeEditPrivate *this,EmitPolicy ep)

{
  long *plVar1;
  int iVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  int pos;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d._0_4_ = 0xaaaaaaaa;
  local_48.d._4_4_ = 0xaaaaaaaa;
  local_48.ptr._0_4_ = 0xaaaaaaaa;
  local_48.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
            (&local_48,this);
  QLineEdit::cursorPosition((this->super_QAbstractSpinBoxPrivate).edit);
  iVar2 = (**(code **)(*plVar1 + 0x1a0))(plVar1,&local_48);
  if ((iVar2 == 2) ||
     ((this->super_QAbstractSpinBoxPrivate).correctionMode != CorrectToPreviousValue)) {
LAB_003c3f82:
    QAbstractSpinBoxPrivate::interpret(&this->super_QAbstractSpinBoxPrivate,ep);
  }
  else {
    if ((iVar2 != 0) && (-1 < *(int *)&this->field_0x3e0)) {
      uVar3 = QDateTimeParser::fieldInfo((int)this + 0x3d8);
      if ((uVar3 & 4) != 0) goto LAB_003c3f82;
    }
    QAbstractSpinBoxPrivate::setValue
              (&this->super_QAbstractSpinBoxPrivate,&(this->super_QAbstractSpinBoxPrivate).value,ep,
               true);
    updateTimeZone(this);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::interpret(EmitPolicy ep)
{
    Q_Q(QDateTimeEdit);
    QString tmp = displayText();
    int pos = edit->cursorPosition();
    const QValidator::State state = q->validate(tmp, pos);
    if (state != QValidator::Acceptable
        && correctionMode == QAbstractSpinBox::CorrectToPreviousValue
        && (state == QValidator::Invalid
            || currentSectionIndex < 0
            || !(fieldInfo(currentSectionIndex) & AllowPartial))) {
        setValue(value, ep);
        updateTimeZone();
    } else {
        QAbstractSpinBoxPrivate::interpret(ep);
    }
}